

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADRender.cpp
# Opt level: O0

void adaptive_distributed_render_scene
               (Scene *scene,double HalfWidth,double HalfHeight,int nx,int ny,int nxSub,int nySub,
               double Variance,char *PicFileName)

{
  double dVar1;
  double this;
  pointer pTVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  bool local_211;
  rgb local_1a8 [2];
  Vector local_1a0;
  Vector local_188;
  Vector local_170;
  Color local_158;
  int local_140;
  int local_13c;
  int jSub;
  int iSub;
  double d;
  double y1;
  double x1;
  rgb local_10b;
  rgb c;
  __single_object tga;
  undefined1 auStack_f8 [4];
  int Count;
  Vector Mean;
  Vector Sum;
  Vector Color;
  int j;
  int i;
  double Disp;
  double hySub;
  double hxSub;
  double hy;
  double hx;
  Ray ray;
  double y;
  double x;
  char *PicFileName_local;
  double Variance_local;
  int nySub_local;
  int nxSub_local;
  int ny_local;
  int nx_local;
  double HalfHeight_local;
  double HalfWidth_local;
  Scene *scene_local;
  
  x = (double)PicFileName;
  PicFileName_local = (char *)Variance;
  Variance_local._0_4_ = nySub;
  Variance_local._4_4_ = nxSub;
  nySub_local = ny;
  nxSub_local = nx;
  _ny_local = HalfHeight;
  HalfHeight_local = HalfWidth;
  HalfWidth_local = (double)scene;
  Ray::Ray((Ray *)&hx);
  dVar3 = (HalfHeight_local + HalfHeight_local) / (double)nxSub_local;
  dVar4 = (_ny_local + _ny_local) / (double)nySub_local;
  dVar10 = (double)Variance_local._4_4_;
  dVar11 = (double)Variance_local._0_4_;
  Vector::Vector((Vector *)&Sum.z);
  Vector::Vector((Vector *)&Mean.z);
  Vector::Vector((Vector *)auStack_f8);
  std::make_unique<TargaImage,char_const*&,int&,int&>
            ((char **)&stack0xfffffffffffffef8,(int *)&x,&nxSub_local);
  rgb::rgb(&local_10b,'\0');
  ray.dir.z = _ny_local;
  for (Color.z._4_4_ = 0; Color.z._4_4_ < nySub_local; Color.z._4_4_ = Color.z._4_4_ + 1) {
    y = -HalfHeight_local;
    for (Color.z._0_4_ = 0; Color.z._0_4_ < nxSub_local; Color.z._0_4_ = Color.z._0_4_ + 1) {
      y1 = dVar3 * -0.5 + y;
      d = dVar4 * -0.5 + ray.dir.z;
      Vector::operator=((Vector *)&Mean.z,0.0);
      _j = 0.0;
      tga._M_t.super___uniq_ptr_impl<TargaImage,_std::default_delete<TargaImage>_>._M_t.
      super__Tuple_impl<0UL,_TargaImage_*,_std::default_delete<TargaImage>_>.
      super__Head_base<0UL,_TargaImage_*,_false>._M_head_impl._4_4_ = 0;
      TotalPixels = TotalPixels + 1;
      do {
        for (local_13c = 0; local_13c < Variance_local._4_4_; local_13c = local_13c + 1) {
          for (local_140 = 0; this = HalfWidth_local, dVar9 = y1, local_140 < Variance_local._0_4_;
              local_140 = local_140 + 1) {
            dVar5 = (double)local_13c;
            dVar6 = rnd();
            dVar1 = d;
            dVar7 = (double)local_140;
            dVar8 = rnd();
            Scene::camera((Scene *)this,(dVar3 / dVar10) * (dVar5 + dVar6) + dVar9,
                          (dVar4 / dVar11) * (dVar7 + dVar8) + dVar1,(Ray *)&hx);
            Scene::trace(&local_158,(Scene *)HalfWidth_local,&Grayzer::Medium::air,1.0,(Ray *)&hx);
            Vector::operator=((Vector *)&Sum.z,&local_158);
            Vector::operator+=((Vector *)&Mean.z,(Vector *)&Sum.z);
            dVar9 = operator&((Vector *)&Sum.z,(Vector *)&Sum.z);
            _j = dVar9 + _j;
            tga._M_t.super___uniq_ptr_impl<TargaImage,_std::default_delete<TargaImage>_>._M_t.
            super__Tuple_impl<0UL,_TargaImage_*,_std::default_delete<TargaImage>_>.
            super__Head_base<0UL,_TargaImage_*,_false>._M_head_impl._4_4_ =
                 tga._M_t.super___uniq_ptr_impl<TargaImage,_std::default_delete<TargaImage>_>._M_t.
                 super__Tuple_impl<0UL,_TargaImage_*,_std::default_delete<TargaImage>_>.
                 super__Head_base<0UL,_TargaImage_*,_false>._M_head_impl._4_4_ + 1;
          }
        }
        operator/(&local_170,(Vector *)&Mean.z,
                  (double)tga._M_t.
                          super___uniq_ptr_impl<TargaImage,_std::default_delete<TargaImage>_>._M_t.
                          super__Tuple_impl<0UL,_TargaImage_*,_std::default_delete<TargaImage>_>.
                          super__Head_base<0UL,_TargaImage_*,_false>._M_head_impl._4_4_);
        Vector::operator=((Vector *)auStack_f8,&local_170);
        dVar9 = operator&((Vector *)auStack_f8,(Vector *)auStack_f8);
        _jSub = ((_j / (double)tga._M_t.
                               super___uniq_ptr_impl<TargaImage,_std::default_delete<TargaImage>_>.
                               _M_t.
                               super__Tuple_impl<0UL,_TargaImage_*,_std::default_delete<TargaImage>_>
                               .super__Head_base<0UL,_TargaImage_*,_false>._M_head_impl._4_4_ -
                 dVar9) * (double)tga._M_t.
                                  super___uniq_ptr_impl<TargaImage,_std::default_delete<TargaImage>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_TargaImage_*,_std::default_delete<TargaImage>_>
                                  .super__Head_base<0UL,_TargaImage_*,_false>._M_head_impl._4_4_) /
                (double)(tga._M_t.
                         super___uniq_ptr_impl<TargaImage,_std::default_delete<TargaImage>_>._M_t.
                         super__Tuple_impl<0UL,_TargaImage_*,_std::default_delete<TargaImage>_>.
                         super__Head_base<0UL,_TargaImage_*,_false>._M_head_impl._4_4_ + -1);
        local_211 = (double)PicFileName_local <=
                    _jSub / (double)tga._M_t.
                                    super___uniq_ptr_impl<TargaImage,_std::default_delete<TargaImage>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_TargaImage_*,_std::default_delete<TargaImage>_>
                                    .super__Head_base<0UL,_TargaImage_*,_false>._M_head_impl._4_4_
                    && tga._M_t.super___uniq_ptr_impl<TargaImage,_std::default_delete<TargaImage>_>.
                       _M_t.super__Tuple_impl<0UL,_TargaImage_*,_std::default_delete<TargaImage>_>.
                       super__Head_base<0UL,_TargaImage_*,_false>._M_head_impl._4_4_ < 99;
      } while (local_211);
      Vector::Vector(&local_188,(Vector *)auStack_f8);
      clip(&local_1a0,&local_188);
      local_10b.g = (uint8_t)(int)(Mean.x * 255.0);
      local_10b.r = (uint8_t)(int)(_auStack_f8 * 255.0);
      local_10b.b = (uint8_t)(int)(Mean.y * 255.0);
      pTVar2 = std::unique_ptr<TargaImage,_std::default_delete<TargaImage>_>::operator->
                         ((unique_ptr<TargaImage,_std::default_delete<TargaImage>_> *)
                          &stack0xfffffffffffffef8);
      local_1a8[0] = (rgb)CONCAT12(local_10b.b,local_10b._0_2_);
      (*(pTVar2->super_Image)._vptr_Image[3])(pTVar2,CONCAT53(0,local_1a8[0]));
      y = dVar3 + y;
    }
    ray.dir.z = ray.dir.z - dVar4;
  }
  std::unique_ptr<TargaImage,_std::default_delete<TargaImage>_>::~unique_ptr
            ((unique_ptr<TargaImage,_std::default_delete<TargaImage>_> *)&stack0xfffffffffffffef8);
  return;
}

Assistant:

void adaptive_distributed_render_scene(
   Scene* scene,
   double HalfWidth,double HalfHeight,
   int   nx,int ny,int nxSub,int nySub,
   double Variance,
   char const*PicFileName)
{
   double x,y;                // sample point
   Ray   ray;                 // pixel ray
   double hx = 2.0   * HalfWidth / nx;   // pixel width
   double hy = 2.0   * HalfHeight / ny;     // pixel height
   double hxSub = hx /  nxSub;
   double hySub = hy /  nySub;
   double Disp;               // dispersion squared
   int   i,j;
   Vector Color;
   Vector Sum;
   Vector Mean;
   int   Count;

   auto tga = std::make_unique<TargaImage>(PicFileName, nx, ny);
   rgb   c;

   for(i = 0, y = HalfHeight; i < ny; i++, y -= hy)
   {
      for(j = 0, x = -HalfWidth; j < nx; j++, x += hx)
      {
         double x1 = x - 0.5 * hx;
         double y1 = y - 0.5 * hy;
         double d;

         Sum   = 0;
         Disp  = 0;
         Count = 0;

         TotalPixels++;

         do {
            for(int  iSub = 0; iSub < nxSub; iSub++)
            {
               for(int  jSub = 0; jSub < nySub; jSub++)
               {
                  scene->camera(x1+hxSub*(iSub+rnd()),y1+hySub*(jSub+rnd()),ray);
                  Color = scene->trace( Grayzer::Medium::air, 1.0, ray );
                  Sum  += Color;
                  Disp += Color & Color;
                  Count++;
               }
            }
            Mean = Sum / Count;
            d =   (Disp /  Count -  (Mean &  Mean)) * Count / (Count - 1);
         } while(d / Count >= Variance && Count < 99);

         clip( Mean );
         c.r   = Mean.x * 255;
         c.g   = Mean.y * 255;
         c.b   = Mean.z * 255;

         tga->put_pixel(c);
      }
   }
}